

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_3,bool polish)

{
  type_conflict5 tVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  long lVar6;
  int *piVar7;
  byte in_CL;
  DataArray<int> *this_00;
  undefined8 in_RSI;
  long *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  bool instable;
  int cnt;
  int nr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sel;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  max;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff548;
  undefined7 in_stack_fffffffffffff550;
  undefined1 in_stack_fffffffffffff557;
  undefined1 uVar8;
  SPxId *in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff564;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff578;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *maxabs_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *max_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5b0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff5b8;
  double in_stack_fffffffffffff5d0;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff5d8;
  int local_a18;
  undefined1 local_a14 [12];
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff5f8;
  undefined1 local_9dc [56];
  int local_9a4;
  undefined1 local_9a0 [32];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff680;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff688;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff690;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff698;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff6a0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6a8;
  int *in_stack_fffffffffffff6b0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6b8;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff6d8;
  undefined1 local_8e8 [56];
  undefined1 local_8b0 [56];
  undefined1 local_878 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff798;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7ac;
  SPxId *in_stack_fffffffffffff7b0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff7b8;
  undefined1 local_840 [56];
  undefined1 local_808 [56];
  undefined1 local_7d0 [56];
  DataKey local_798;
  undefined8 local_790;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_784;
  undefined1 local_74c [56];
  undefined1 local_714 [56];
  int local_6dc;
  undefined1 local_6d8 [56];
  undefined1 local_6a0 [43];
  undefined1 in_stack_fffffffffffff98b;
  int in_stack_fffffffffffff98c;
  SPxId *in_stack_fffffffffffff990;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff998;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9a0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff9a8;
  undefined1 in_stack_fffffffffffff9bb;
  int in_stack_fffffffffffff9bc;
  SPxId *in_stack_fffffffffffff9c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9d0;
  DataKey in_stack_fffffffffffff9d8;
  undefined1 local_620 [56];
  undefined1 local_5e8 [56];
  undefined1 local_5b0 [56];
  undefined1 local_578 [56];
  undefined1 local_540 [56];
  undefined1 local_508 [56];
  DataKey local_4d0;
  undefined8 local_4c8 [8];
  undefined8 local_488 [3];
  Real local_470;
  undefined1 local_468 [59];
  byte local_42d;
  int local_42c;
  undefined1 local_418 [16];
  Real local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_400;
  undefined8 local_3c8;
  undefined1 local_3c0 [56];
  undefined1 local_388 [56];
  undefined1 local_350 [56];
  DataKey local_318;
  byte local_30d;
  undefined8 local_308;
  DataKey local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  Real *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  undefined8 local_2c0;
  Real *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 *local_170;
  Real *local_168;
  Real *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined1 *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined1 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined1 *local_118;
  undefined8 *local_110;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_101;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  long local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  int *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  int *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  int *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_30d = in_CL & 1;
  local_308 = in_RSI;
  SPxId::SPxId((SPxId *)0x393f73);
  local_2a8 = local_350;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
  local_2a0 = local_388;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
  local_3c8 = 0;
  local_2e0 = local_3c0;
  local_2e8 = &local_3c8;
  local_2f0 = 0;
  max_00 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)0x0;
  local_158 = local_2e8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             (double)in_stack_fffffffffffff558,
             (type *)CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
  maxabs_00 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_418;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(&in_stack_fffffffffffff548->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              );
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x394038);
  local_408 = Tolerances::scaleAccordingToEpsilon(peVar5,1e-05);
  local_2c8 = &local_400;
  local_2d0 = &local_408;
  local_2d8 = 0;
  local_160 = local_2d0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             (double)in_stack_fffffffffffff558,
             (type *)CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3940bc);
  local_42c = 0;
  resetTols(in_stack_fffffffffffff578);
  lVar6 = (**(code **)(*in_RDI + 0x18))();
  local_42d = *(byte *)(lVar6 + 0x670) & 1;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(&in_stack_fffffffffffff548->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              );
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x39410f);
  local_470 = Tolerances::scaleAccordingToEpsilon(peVar5,1e-10);
  local_2b0 = local_468;
  local_2b8 = &local_470;
  local_2c0 = 0;
  local_168 = local_2b8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             (double)in_stack_fffffffffffff558,
             (type *)CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x394192);
  local_488[0] = 0;
  local_118 = local_388;
  local_120 = local_488;
  local_110 = local_120;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
  epsilonZero(in_stack_fffffffffffff548);
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff548,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x394218);
  if (tVar1) {
    do {
      local_4c8[0] = 0;
      local_130 = local_3c0;
      local_138 = local_4c8;
      local_128 = local_138;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
      local_170 = local_350;
      local_178 = local_308;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
      local_4d0 = (DataKey)maxDelta(in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0,
                                    max_00,maxabs_00);
      local_318 = local_4d0;
      bVar2 = SPxId::isValid((SPxId *)&local_318);
      if (!bVar2) {
        return (SPxId)local_318;
      }
      local_270 = local_508;
      local_278 = local_350;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
      local_260 = local_540;
      local_268 = local_3c0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
      bVar2 = shortEnter(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                         in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,
                         in_stack_fffffffffffff798);
      if (!bVar2) {
        local_298 = local_578;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
        local_290 = local_5b0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
        local_250 = local_620;
        local_258 = local_3c0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
        minStability(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
        local_1a0 = local_5b0;
        local_1a8 = local_5e8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
        if ((local_42d & 1) == 0) {
          local_230 = local_6a0;
          local_238 = local_350;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
          local_318 = (DataKey)maxSelect(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                                         in_stack_fffffffffffff698,in_stack_fffffffffffff690);
        }
        else {
          local_240 = &stack0xfffffffffffff9a0;
          local_248 = local_350;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
          in_stack_fffffffffffff9d8 =
               (DataKey)maxSelect(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                                  in_stack_fffffffffffff698,in_stack_fffffffffffff690);
          local_318 = in_stack_fffffffffffff9d8;
        }
        local_6dc = 2;
        local_70 = local_6d8;
        local_78 = &local_400;
        local_80 = &local_6dc;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_81,local_78);
        local_68 = local_6d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
        local_50 = local_6d8;
        local_58 = local_78;
        local_60 = local_80;
        local_90 = (long)*local_80;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548,(longlong *)0x394695);
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff548,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3946aa);
        if (tVar1) {
          local_42c = local_42c + 1;
        }
        else {
          local_42c = local_42c + 2;
        }
      }
      local_220 = local_714;
      local_228 = local_3c0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
      bVar2 = maxReEnter((SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                         in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
                         in_stack_fffffffffffff9bc,(bool)in_stack_fffffffffffff9bb);
    } while ((bVar2) && (relax(in_stack_fffffffffffff5f8), local_42c < 2));
  }
  else {
    epsilonZero(in_stack_fffffffffffff548);
    local_f8 = local_74c;
    local_100 = &local_784;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_101,local_100);
    local_e8 = local_74c;
    local_f0 = local_100;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
    local_e0 = local_74c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff548,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x39481d);
    if (tVar1) {
      do {
        local_790 = 0;
        local_148 = local_3c0;
        local_150 = &local_790;
        local_140 = local_150;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
        local_180 = local_350;
        local_188 = local_308;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
        local_798 = (DataKey)minDelta(in_stack_fffffffffffff5b8,(int *)in_stack_fffffffffffff5b0,
                                      max_00,maxabs_00);
        local_318 = local_798;
        bVar2 = SPxId::isValid((SPxId *)&local_318);
        if (!bVar2) {
          return (SPxId)local_318;
        }
        local_210 = local_7d0;
        local_218 = local_350;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
        local_200 = local_808;
        local_208 = local_3c0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
        bVar2 = shortEnter(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                           in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a0,
                           in_stack_fffffffffffff798);
        if (!bVar2) {
          local_288 = local_840;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
          local_280 = local_878;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
          local_1f0 = local_8e8;
          local_1f8 = local_3c0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
          minStability(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0);
          local_1b0 = local_878;
          local_1b8 = local_8b0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
          if ((local_42d & 1) == 0) {
            local_1d0 = &stack0xfffffffffffff698;
            local_1d8 = local_350;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                       (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
            local_318 = (DataKey)minSelect(in_stack_fffffffffffff6a8,
                                           (int *)in_stack_fffffffffffff6a0,
                                           in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                                           in_stack_fffffffffffff688,in_stack_fffffffffffff680);
          }
          else {
            local_1e0 = &stack0xfffffffffffff6d8;
            local_1e8 = local_350;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                       (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
            local_318 = (DataKey)minSelect(in_stack_fffffffffffff6a8,
                                           (int *)in_stack_fffffffffffff6a0,
                                           in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                                           in_stack_fffffffffffff688,in_stack_fffffffffffff680);
          }
          local_9a4 = 2;
          local_b8 = local_9a0;
          local_c0 = &local_400;
          local_c8 = &local_9a4;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_c9,local_c0);
          local_b0 = local_9a0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550));
          local_98 = local_9a0;
          local_a0 = local_c0;
          local_a8 = local_c8;
          local_d8 = (long)*local_c8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                     (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548,(longlong *)0x394c4e
                    );
          tVar1 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff548,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x394c63);
          if (tVar1) {
            local_42c = local_42c + 1;
          }
          else {
            local_42c = local_42c + 2;
          }
        }
        local_1c0 = local_9dc;
        local_1c8 = local_3c0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
        bVar2 = minReEnter(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
                           in_stack_fffffffffffff998,in_stack_fffffffffffff990,
                           in_stack_fffffffffffff98c,(bool)in_stack_fffffffffffff98b);
      } while ((bVar2) && (relax(in_stack_fffffffffffff5f8), local_42c < 2));
    }
  }
  if (((local_30d & 1) != 0) && (bVar2 = SPxId::isValid((SPxId *)&local_318), bVar2)) {
    if (*(int *)(in_RDI[1] + 0x404) == 1) {
      bVar2 = SPxId::isSPxRowId((SPxId *)&local_318);
      if (bVar2) {
        SPxId::SPxId((SPxId *)0x394d77);
        return (SPxId)local_2f8;
      }
      iVar3 = DataArray<int>::size((DataArray<int> *)(in_RDI[1] + 0xdb0));
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x394da5);
      if (iVar3 == iVar4) {
        lVar6 = in_RDI[1];
        iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                         in_stack_fffffffffffff558);
        piVar7 = DataArray<int>::operator[]((DataArray<int> *)(lVar6 + 0xdb0),iVar3);
        if (*piVar7 == 0) {
          SPxId::SPxId((SPxId *)0x394df3);
          return (SPxId)local_2f8;
        }
      }
    }
    else if (*(int *)(in_RDI[1] + 0x404) == 2) {
      iVar3 = DataArray<int>::size((DataArray<int> *)(in_RDI[1] + 0xdb0));
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x394e3e);
      if (iVar3 == iVar4) {
        bVar2 = SPxId::isSPxColId((SPxId *)&local_318);
        if (bVar2) {
          this_00 = (DataArray<int> *)(in_RDI[1] + 0xdb0);
          iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(iVar3,in_stack_fffffffffffff560),(SPxId *)this_00);
          piVar7 = DataArray<int>::operator[](this_00,iVar3);
          if (*piVar7 == 1) {
            SPxId::SPxId((SPxId *)0x394e9f);
            return (SPxId)local_2f8;
          }
        }
      }
      else {
        bVar2 = SPxId::isSPxColId((SPxId *)&local_318);
        if (bVar2) {
          SPxId::SPxId((SPxId *)0x394ec6);
          return (SPxId)local_2f8;
        }
      }
    }
  }
  bVar2 = SPxId::isValid((SPxId *)&local_318);
  uVar8 = true;
  if (!bVar2) {
    in_stack_fffffffffffff548 =
         (SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(in_RDI + 0xd);
    local_a18 = 2;
    epsilonZero(in_stack_fffffffffffff548);
    local_28 = local_a14;
    local_30 = &local_a18;
    local_38 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&stack0xfffffffffffff5b0;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = local_a14;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)CONCAT17(uVar8,in_stack_fffffffffffff550));
    local_8 = local_a14;
    local_10 = local_38;
    local_18 = local_30;
    local_48 = (long)*local_30;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              ((cpp_dec_float<50U,_int,_void> *)CONCAT17(uVar8,in_stack_fffffffffffff550),
               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548,(longlong *)0x394fd5);
    uVar8 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff548,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x394fe6);
  }
  if ((type_conflict5)uVar8 != false) {
    local_190 = local_308;
    local_198 = local_388;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)CONCAT17(uVar8,in_stack_fffffffffffff550),
               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff548);
    bVar2 = SPxId::isValid((SPxId *)&local_318);
    if (bVar2) {
      tighten(in_stack_fffffffffffff6d8);
    }
  }
  return (SPxId)local_318;
}

Assistant:

SPxId SPxFastRT<R>::selectEnter(R& val, int, bool polish)
{
   SPxId enterId;
   R max, sel;
   R maxabs = 0.0;
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   int nr;
   int cnt = 0;

   assert(this->m_type == SPxSolverBase<R>::LEAVE);

   resetTols();

   // force instable pivot iff true (see explanation in leave.hpp and spxsolve.hpp)
   bool instable = this->solver()->instableLeave;
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   assert(!instable || this->solver()->instableLeaveNum >= 0);

   sel = 0.0;

   if(val > epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;

         enterId = maxDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max >= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = maxSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = maxSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!maxReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else if(val < -epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;
         enterId = minDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max <= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = minSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = minSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!minReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }

   SPX_DEBUG(

      if(enterId.isValid())
{
   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

      R x;

      if(this->thesolver->isCoId(enterId))
         x = this->thesolver->coPvec().delta()[ this->thesolver->number(enterId) ];
      else
         x = this->thesolver->pVec().delta()[ this->thesolver->number(enterId) ];

      std::cout << "DFSTRT03 " << this->thesolver->basis().iteration() << ": "
                << sel << '\t' << x << " (" << maxabs << ")" << std::endl;
   }
   else
      std::cout << "DFSTRT04 " << this->thesolver->basis().iteration()
                << ": skipping instable pivot" << std::endl;
      )

      if(polish && enterId.isValid())
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);

         // decide whether the chosen entering index contributes to the polishing objective
         if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_INTEGRALITY)
         {
            // only allow (integer) variables to enter the basis
            if(enterId.isSPxRowId())
               return SPxId();
            else if(this->thesolver->integerVariables.size() == this->thesolver->nCols()
                    && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 0)
               return SPxId();
         }
         else if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_FRACTIONALITY)
         {
            // only allow slacks and continuous variables to enter the basis
            if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
            {
               if(enterId.isSPxColId() && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 1)
                  return SPxId();
            }
            else if(enterId.isSPxColId())
               return SPxId();
         }
      }


   if(enterId.isValid() || minStab > 2 * epsilonZero())
   {
      val = sel;

      if(enterId.isValid())
         tighten();
   }

   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

   return enterId;
}